

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crnlib.cpp
# Opt level: O0

char * crn_get_file_type_ext(crn_file_type file_type)

{
  char *pcStack_10;
  crn_file_type file_type_local;
  
  if (file_type == cCRNFileTypeCRN) {
    pcStack_10 = "crn";
  }
  else if (file_type == cCRNFileTypeDDS) {
    pcStack_10 = "dds";
  }
  else {
    pcStack_10 = "?";
  }
  return pcStack_10;
}

Assistant:

const char* crn_get_file_type_ext(crn_file_type file_type)
{
    switch (file_type)
    {
    case cCRNFileTypeDDS:
        return "dds";
    case cCRNFileTypeCRN:
        return "crn";
    default:
        break;
    }
    return "?";
}